

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::~SimpleLoggerMgr(SimpleLoggerMgr *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> l_1;
  unique_lock<std::mutex> l;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
  *in_stack_ffffffffffffffd0;
  
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffbf);
  signal(0xb,*(__sighandler_t *)&in_RDI[0x1c]._M_owns);
  signal(6,*(__sighandler_t *)&in_RDI[0x1d]._M_device);
  std::unique_lock<std::mutex>::unique_lock
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  std::unique_lock<std::mutex>::unique_lock
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  bVar1 = std::thread::joinable((thread *)in_RDI);
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::thread::joinable((thread *)in_RDI);
  if (bVar1) {
    std::thread::join();
  }
  free(*(void **)&in_RDI[0x1f]._M_owns);
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
  ~vector(in_stack_ffffffffffffffd0);
  std::ofstream::~ofstream(&in_RDI[0x22]._M_owns);
  std::__cxx11::string::~string((string *)&in_RDI[0x20]._M_owns);
  std::__cxx11::string::~string((string *)&in_RDI[0x1d]._M_owns);
  std::condition_variable::~condition_variable((condition_variable *)&in_RDI[0x16]._M_owns);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x11));
  std::__cxx11::list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::
  ~list((list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_> *)0x10a61c)
  ;
  std::thread::~thread((thread *)0x10a62d);
  std::thread::~thread((thread *)0x10a63e);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x10a64f);
  std::
  unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
  ::~unordered_set((unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
                    *)0x10a65d);
  return;
}

Assistant:

SimpleLoggerMgr::~SimpleLoggerMgr() {
    termination = true;

#if defined(__linux__) || defined(__APPLE__)
    signal(SIGSEGV, oldSigSegvHandler);
    signal(SIGABRT, oldSigAbortHandler);
#endif
    {   std::unique_lock<std::mutex> l(cvFlusherLock);
        cvFlusher.notify_all();
    }
    {   std::unique_lock<std::mutex> l(cvCompressorLock);
        cvCompressor.notify_all();
    }
    if (tFlush.joinable()) {
        tFlush.join();
    }
    if (tCompress.joinable()) {
        tCompress.join();
    }

    free(stackTraceBuffer);
}